

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int sock_destroy(SOCKINFO *info,int ShutdownMethod)

{
  int iVar1;
  int *piVar2;
  undefined1 local_118 [8];
  char errorBuffer [256];
  int ret;
  int ShutdownMethod_local;
  SOCKINFO *info_local;
  
  errorBuffer[0xf8] = '\0';
  errorBuffer[0xf9] = '\0';
  errorBuffer[0xfa] = '\0';
  errorBuffer[0xfb] = '\0';
  if (info->socket != -1) {
    errorBuffer._252_4_ = ShutdownMethod;
    iVar1 = shutdown(info->socket,ShutdownMethod);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      __xpg_strerror_r(*piVar2,local_118,0x100);
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/sock.c",0x89,"Error in shutdown: %s\n",
                 local_118);
    }
    iVar1 = sock_close(info->socket);
    if (iVar1 == -1) {
      errorBuffer[0xf8] = '0';
      errorBuffer[0xf9] = -1;
      errorBuffer[0xfa] = -1;
      errorBuffer[0xfb] = -1;
    }
    info->socket = -1;
  }
  iVar1._0_1_ = errorBuffer[0xf8];
  iVar1._1_1_ = errorBuffer[0xf9];
  iVar1._2_1_ = errorBuffer[0xfa];
  iVar1._3_1_ = errorBuffer[0xfb];
  return iVar1;
}

Assistant:

int sock_destroy(SOCKINFO *info, int ShutdownMethod)
{
	int ret = UPNP_E_SUCCESS;
	char errorBuffer[ERROR_BUFFER_LEN];

	if (info->socket != INVALID_SOCKET) {
#ifdef UPNP_ENABLE_OPEN_SSL
		if (info->ssl) {
			SSL_shutdown(info->ssl);
			SSL_free(info->ssl);
			info->ssl = NULL;
		}
#endif
		if (shutdown(info->socket, ShutdownMethod) == -1) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"Error in shutdown: %s\n",
				errorBuffer);
		}
		if (sock_close(info->socket) == -1) {
			ret = UPNP_E_SOCKET_ERROR;
		}
		info->socket = INVALID_SOCKET;
	}

	return ret;
}